

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderBaseUri(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlTextReaderPtr pxStack_20;
  int result;
  xmlChar *ret;
  xmlTextReaderPtr reader_local;
  
  pxStack_20 = (xmlTextReaderPtr)0x0;
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    ret = (xmlChar *)reader;
    iVar1 = xmlNodeGetBaseSafe((xmlDoc *)0x0,reader->node,(xmlChar **)&stack0xffffffffffffffe0);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory((xmlTextReaderPtr)ret);
    }
    reader_local = pxStack_20;
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderBaseUri(xmlTextReaderPtr reader) {
    xmlChar *ret = NULL;
    int result;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    result = xmlNodeGetBaseSafe(NULL, reader->node, &ret);
    if (result < 0)
        xmlTextReaderErrMemory(reader);

    return(ret);
}